

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_cjson.c
# Opt level: O2

void json_append_data(lua_State *l,json_config_t *cfg,int current_depth,strbuf_t *json)

{
  uint current_depth_00;
  int iVar1;
  int iVar2;
  void *pvVar3;
  bool bVar4;
  char *c;
  ulong n;
  int iVar5;
  lua_Number __x;
  double dVar6;
  int iStack_50;
  
  iVar1 = lua_type(l,-1);
  switch(iVar1) {
  case 1:
    iVar1 = lua_toboolean(l,-1);
    if (iVar1 == 0) {
      c = "false";
      iStack_50 = 5;
      goto LAB_0013868e;
    }
    c = "true";
    break;
  case 2:
    pvVar3 = lua_touserdata(l,-1);
    if (pvVar3 != (void *)0x0) goto LAB_0013865f;
  case 0:
    c = "null";
    break;
  case 3:
    json_append_number(l,cfg,json,-1);
    return;
  case 4:
    json_append_string(l,json,-1);
    return;
  case 5:
    current_depth_00 = current_depth + 1;
    if ((cfg->encode_max_depth <= current_depth) || (iVar1 = lua_checkstack(l,3), iVar1 == 0)) {
      if (cfg->encode_keep_buffer == 0) {
        strbuf_free(json);
      }
      luaL_error(l,"Cannot serialise, excessive nesting (%d)",(ulong)current_depth_00);
    }
    lua_pushnil(l);
    iVar5 = 0;
    iVar1 = 0;
    while (iVar2 = lua_next(l,-2), iVar2 != 0) {
      iVar2 = lua_type(l,-2);
      if (iVar2 != 3) {
LAB_0013879b:
        lua_settop(l,-3);
        goto LAB_001387a6;
      }
      __x = lua_tonumberx(l,-2,(int *)0x0);
      if (((__x == 0.0) && (!NAN(__x))) ||
         ((dVar6 = floor(__x), __x < 1.0 || ((dVar6 != __x || (NAN(dVar6) || NAN(__x)))))))
      goto LAB_0013879b;
      if ((double)iVar5 < __x) {
        iVar5 = (int)__x;
      }
      iVar1 = iVar1 + 1;
      lua_settop(l,-2);
    }
    if (((cfg->encode_sparse_ratio < 1) || (iVar5 <= cfg->encode_sparse_ratio * iVar1)) ||
       (iVar5 <= cfg->encode_sparse_safe)) {
      if (0 < iVar5) {
        strbuf_append_char(json,'[');
        bVar4 = true;
        for (n = 1; iVar5 + 1 != n; n = n + 1) {
          if (!bVar4) {
            strbuf_append_char(json,',');
          }
          lua_rawgeti(l,-1,n);
          json_append_data(l,cfg,current_depth_00,json);
          lua_settop(l,-2);
          bVar4 = false;
        }
        iStack_50._0_1_ = ']';
        goto LAB_00138886;
      }
    }
    else if (cfg->encode_sparse_convert == 0) {
      json_encode_exception(l,cfg,json,-1,"excessively sparse array");
    }
LAB_001387a6:
    strbuf_append_char(json,'{');
    lua_pushnil(l);
    bVar4 = true;
    while (iVar1 = lua_next(l,-2), iVar1 != 0) {
      if (!bVar4) {
        strbuf_append_char(json,',');
      }
      iVar1 = lua_type(l,-2);
      if (iVar1 == 4) {
        json_append_string(l,json,-2);
        strbuf_append_char(json,':');
      }
      else if (iVar1 == 3) {
        strbuf_append_char(json,'\"');
        json_append_number(l,cfg,json,-2);
        strbuf_append_mem(json,"\":",2);
      }
      else {
        json_encode_exception(l,cfg,json,-2,"table key must be a number or string");
      }
      json_append_data(l,cfg,current_depth_00,json);
      lua_settop(l,-2);
      bVar4 = false;
    }
    iStack_50._0_1_ = '}';
LAB_00138886:
    strbuf_append_char(json,(char)iStack_50);
    return;
  default:
LAB_0013865f:
    json_encode_exception(l,cfg,json,-1,"type not supported");
    return;
  }
  iStack_50 = 4;
LAB_0013868e:
  strbuf_append_mem(json,c,iStack_50);
  return;
}

Assistant:

static void json_append_data(lua_State *l, json_config_t *cfg,
                             int current_depth, strbuf_t *json)
{
    int len;

    switch (lua_type(l, -1)) {
    case LUA_TSTRING:
        json_append_string(l, json, -1);
        break;
    case LUA_TNUMBER:
        json_append_number(l, cfg, json, -1);
        break;
    case LUA_TBOOLEAN:
        if (lua_toboolean(l, -1))
            strbuf_append_mem(json, "true", 4);
        else
            strbuf_append_mem(json, "false", 5);
        break;
    case LUA_TTABLE:
        current_depth++;
        json_check_encode_depth(l, cfg, current_depth, json);
        len = lua_array_length(l, cfg, json);
        if (len > 0)
            json_append_array(l, cfg, current_depth, json, len);
        else
            json_append_object(l, cfg, current_depth, json);
        break;
    case LUA_TNIL:
        strbuf_append_mem(json, "null", 4);
        break;
    case LUA_TLIGHTUSERDATA:
        if (lua_touserdata(l, -1) == NULL) {
            strbuf_append_mem(json, "null", 4);
            break;
        }
    default:
        /* Remaining types (LUA_TFUNCTION, LUA_TUSERDATA, LUA_TTHREAD,
         * and LUA_TLIGHTUSERDATA) cannot be serialised */
        json_encode_exception(l, cfg, json, -1, "type not supported");
        /* never returns */
    }
}